

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMT_HA_Array_Unmarshal(TPMT_HA *target,BYTE **buffer,INT32 *size,BOOL flag,INT32 count)

{
  TPM_RC TVar1;
  int local_38;
  INT32 i;
  TPM_RC result;
  INT32 count_local;
  BOOL flag_local;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMT_HA *target_local;
  
  local_38 = 0;
  while( true ) {
    if (count <= local_38) {
      return 0;
    }
    TVar1 = TPMT_HA_Unmarshal(target + local_38,buffer,size,flag);
    if (TVar1 != 0) break;
    local_38 = local_38 + 1;
  }
  return TVar1;
}

Assistant:

TPM_RC
TPMT_HA_Array_Unmarshal(TPMT_HA *target, BYTE **buffer, INT32 *size, BOOL flag, INT32 count)
{
    TPM_RC    result;
    INT32 i;
    for(i = 0; i < count; i++) {
        result = TPMT_HA_Unmarshal(&target[i], buffer, size, flag);
        if(result != TPM_RC_SUCCESS)
            return result;
    }
    return TPM_RC_SUCCESS;
}